

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv__getpwuid_r(uv_passwd_t *pwd)

{
  uv_passwd_t *puVar1;
  __uid_t __uid;
  int iVar2;
  char *__buffer;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *__dest;
  size_t __buflen;
  passwd *result;
  passwd pw;
  passwd *local_70;
  uv_passwd_t *local_68;
  passwd local_60;
  
  if (pwd == (uv_passwd_t *)0x0) {
    return -0x16;
  }
  __uid = geteuid();
  __buflen = 2000;
  __buffer = (char *)uv__malloc(2000);
  if (__buffer != (char *)0x0) {
    local_68 = pwd;
    do {
      do {
        iVar2 = getpwuid_r(__uid,&local_60,__buffer,__buflen,&local_70);
      } while (iVar2 == 4);
      if ((iVar2 != 0) || (local_70 == (passwd *)0x0)) {
        uv__free(__buffer);
      }
      if (iVar2 != 0x22) {
        if (iVar2 != 0) {
          return -iVar2;
        }
        if (local_70 != (passwd *)0x0) {
          sVar3 = strlen(local_60.pw_name);
          sVar4 = strlen(local_60.pw_dir);
          sVar5 = strlen(local_60.pw_shell);
          __dest = (char *)uv__malloc(sVar5 + sVar4 + sVar3 + 3);
          puVar1 = local_68;
          local_68->username = __dest;
          if (__dest == (char *)0x0) {
            uv__free(__buffer);
            return -0xc;
          }
          memcpy(__dest,local_60.pw_name,sVar3 + 1);
          puVar1->homedir = puVar1->username + sVar3 + 1;
          memcpy(puVar1->username + sVar3 + 1,local_60.pw_dir,sVar4 + 1);
          puVar1->shell = puVar1->homedir + sVar4 + 1;
          memcpy(puVar1->homedir + sVar4 + 1,local_60.pw_shell,sVar5 + 1);
          puVar1->uid = (ulong)local_60.pw_uid;
          puVar1->gid = (ulong)local_60.pw_gid;
          uv__free(__buffer);
          return 0;
        }
        return -2;
      }
      __buflen = __buflen * 2;
      __buffer = (char *)uv__malloc(__buflen);
    } while (__buffer != (char *)0x0);
  }
  return -0xc;
}

Assistant:

int uv__getpwuid_r(uv_passwd_t* pwd) {
  struct passwd pw;
  struct passwd* result;
  char* buf;
  uid_t uid;
  size_t bufsize;
  size_t name_size;
  size_t homedir_size;
  size_t shell_size;
  int r;

  if (pwd == NULL)
    return UV_EINVAL;

  uid = geteuid();

  /* Calling sysconf(_SC_GETPW_R_SIZE_MAX) would get the suggested size, but it
   * is frequently 1024 or 4096, so we can just use that directly. The pwent
   * will not usually be large. */
  for (bufsize = 2000;; bufsize *= 2) {
    buf = uv__malloc(bufsize);

    if (buf == NULL)
      return UV_ENOMEM;

    do
      r = getpwuid_r(uid, &pw, buf, bufsize, &result);
    while (r == EINTR);

    if (r != 0 || result == NULL)
      uv__free(buf);

    if (r != ERANGE)
      break;
  }

  if (r != 0)
    return UV__ERR(r);

  if (result == NULL)
    return UV_ENOENT;

  /* Allocate memory for the username, shell, and home directory */
  name_size = strlen(pw.pw_name) + 1;
  homedir_size = strlen(pw.pw_dir) + 1;
  shell_size = strlen(pw.pw_shell) + 1;
  pwd->username = uv__malloc(name_size + homedir_size + shell_size);

  if (pwd->username == NULL) {
    uv__free(buf);
    return UV_ENOMEM;
  }

  /* Copy the username */
  memcpy(pwd->username, pw.pw_name, name_size);

  /* Copy the home directory */
  pwd->homedir = pwd->username + name_size;
  memcpy(pwd->homedir, pw.pw_dir, homedir_size);

  /* Copy the shell */
  pwd->shell = pwd->homedir + homedir_size;
  memcpy(pwd->shell, pw.pw_shell, shell_size);

  /* Copy the uid and gid */
  pwd->uid = pw.pw_uid;
  pwd->gid = pw.pw_gid;

  uv__free(buf);

  return 0;
}